

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

reference __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
::iterator::operator*(iterator *this)

{
  code *pcVar1;
  long lVar2;
  long lVar3;
  size_t __n;
  int iVar4;
  long *in_RSI;
  undefined1 *puStack_148;
  undefined8 uStack_140;
  undefined1 uStack_138;
  undefined7 uStack_137;
  ulong uStack_128;
  char *pcStack_120;
  ulong uStack_118;
  char *pcStack_110;
  undefined1 auStack_108 [80];
  AlphaNum AStack_b8;
  undefined1 auStack_88 [32];
  long lStack_68;
  code *pcStack_60;
  ulong *puStack_58;
  code *pcStack_50;
  ulong uStack_48;
  code *pcStack_40;
  undefined1 **ppuStack_38;
  code *pcStack_30;
  
  pcVar1 = (code *)this->ctrl_;
  if (pcVar1 == (code *)0x0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
    ::iterator::operator*((iterator *)this);
LAB_00202ceb:
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
    ::iterator::operator*((iterator *)this);
  }
  else {
    if (pcVar1 == absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>)
    goto LAB_00202ceb;
    if (-1 < (char)*pcVar1) {
      return (reference)(this->field_1).slot_;
    }
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
  ::iterator::operator*((iterator *)this);
  lVar2 = *in_RSI;
  pcStack_120 = "default";
  pcStack_110 = "default";
  if ((ulong)*(byte *)(lVar2 + 0x28) != 0) {
    pcStack_110 = "custom";
  }
  uStack_118 = (ulong)*(byte *)(lVar2 + 0x28) ^ 7;
  lVar3 = in_RSI[1];
  if ((ulong)*(byte *)(lVar3 + 0x28) != 0) {
    pcStack_120 = "custom";
  }
  uStack_128 = (ulong)*(byte *)(lVar3 + 0x28) ^ 7;
  uStack_140 = 0;
  uStack_138 = 0;
  __n = *(size_t *)(lVar2 + 0x10);
  puStack_148 = &uStack_138;
  if (__n == *(size_t *)(lVar3 + 0x10)) {
    if (__n == 0) goto LAB_00202e0e;
    iVar4 = bcmp(*(void **)(lVar2 + 8),*(void **)(lVar3 + 8),__n);
    if (iVar4 == 0) goto LAB_00202e0e;
  }
  auStack_88._0_8_ = 3;
  auStack_88._8_8_ = " (\"";
  AStack_b8.piece_._M_str = *(char **)(lVar3 + 8);
  AStack_b8.piece_._M_len = *(size_t *)(lVar3 + 0x10);
  auStack_108[0x20] = '\x02';
  auStack_108[0x21] = '\0';
  auStack_108[0x22] = '\0';
  auStack_108[0x23] = '\0';
  auStack_108[0x24] = '\0';
  auStack_108[0x25] = '\0';
  auStack_108[0x26] = '\0';
  auStack_108[0x27] = '\0';
  auStack_108._40_8_ = "\")";
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)auStack_108,(AlphaNum *)auStack_88,&AStack_b8);
  std::__cxx11::string::operator=((string *)&puStack_148,(string *)auStack_108);
  if ((undefined1 *)auStack_108._0_8_ != auStack_108 + 0x10) {
    operator_delete((void *)auStack_108._0_8_,auStack_108._16_8_ + 1);
  }
LAB_00202e0e:
  auStack_88._16_8_ = *(ulong *)(in_RSI[2] + 0x18) & 0xfffffffffffffffc;
  uStack_48 = *(ulong *)(*(long *)in_RSI[1] + 0x18) & 0xfffffffffffffffc;
  lStack_68 = *in_RSI + 8;
  auStack_88._0_8_ = &uStack_118;
  auStack_88._8_8_ =
       absl::lts_20240722::str_format_internal::FormatArgImpl::
       Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  auStack_88._24_8_ =
       absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<std::__cxx11::string>;
  pcStack_60 = absl::lts_20240722::str_format_internal::FormatArgImpl::
               Dispatch<std::__cxx11::string>;
  puStack_58 = &uStack_128;
  pcStack_50 = absl::lts_20240722::str_format_internal::FormatArgImpl::
               Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  pcStack_40 = absl::lts_20240722::str_format_internal::FormatArgImpl::
               Dispatch<std::__cxx11::string>;
  ppuStack_38 = &puStack_148;
  pcStack_30 = absl::lts_20240722::str_format_internal::FormatArgImpl::
               Dispatch<std::__cxx11::string>;
  absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
            (this,
             "The %s JSON name of field \"%s\" (\"%s\") conflicts with the %s JSON name of field \"%s\"%s."
             ,0x56,auStack_88,6);
  if (puStack_148 != &uStack_138) {
    operator_delete(puStack_148,CONCAT71(uStack_137,uStack_138) + 1);
  }
  return (reference)this;
}

Assistant:

reference operator*() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator*()");
      return unchecked_deref();
    }